

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulist.cpp
# Opt level: O0

UBool ulist_removeString_63(UList *list,char *data)

{
  int iVar1;
  UListNode *local_28;
  UListNode *pointer;
  char *data_local;
  UList *list_local;
  
  if (list != (UList *)0x0) {
    for (local_28 = list->head; local_28 != (UListNode *)0x0; local_28 = local_28->next) {
      iVar1 = strcmp(data,(char *)local_28->data);
      if (iVar1 == 0) {
        ulist_removeItem(list,local_28);
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2 ulist_removeString(UList *list, const char *data) {
    if (list != NULL) {
        UListNode *pointer;
        for (pointer = list->head; pointer != NULL; pointer = pointer->next) {
            if (uprv_strcmp(data, (const char *)pointer->data) == 0) {
                ulist_removeItem(list, pointer);
                // Remove only the first occurrence, like Java LinkedList.remove(Object).
                return TRUE;
            }
        }
    }
    return FALSE;
}